

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::ruby::DumpImportList_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FileDescriptor *file)

{
  Descriptor *d;
  long lVar1;
  int iVar2;
  FileDescriptor *f;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  seen;
  FileDescriptor *local_c8;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
  local_b0;
  undefined8 local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  char *local_68;
  anon_class_16_2_632c2391 local_60;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_50;
  
  iVar2 = 0;
  local_b0.first.ctrl_ = (ctrl_t *)this;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::raw_hash_set<google::protobuf::FileDescriptor_const*const*>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)&local_50,(FileDescriptor **)&local_b0,
             (FileDescriptor **)&local_b0.first.field_1.slot_,0,(hasher *)&local_60,
             (key_equal *)&local_c0,(allocator_type *)&local_c8);
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60.seen =
       (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        *)&local_50;
  local_60.ret = __return_storage_ptr__;
  if (0 < *(int *)(this + 0x3c)) {
    do {
      d = FileDescriptor::message_type((FileDescriptor *)this,iVar2);
      ForEachField<google::protobuf::compiler::ruby::DumpImportList[abi:cxx11](google::protobuf::FileDescriptor_const*)::__0&>
                (d,&local_60);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(this + 0x3c));
  }
  if (0 < *(int *)(this + 4)) {
    iVar2 = 0;
    do {
      FileDescriptor::extension((FileDescriptor *)this,iVar2);
      lVar1 = google::protobuf::FieldDescriptor::message_type();
      if (lVar1 != 0) {
        lVar1 = google::protobuf::FieldDescriptor::message_type();
        local_c8 = *(FileDescriptor **)(lVar1 + 0x10);
        local_c0 = &local_50;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::EmplaceDecomposable::operator()(&local_b0,&local_c0,&local_c8,&local_c8);
        if (local_b0.second == true) {
          lVar1 = google::protobuf::FieldDescriptor::message_type();
          local_98 = *(undefined8 *)(*(long *)(lVar1 + 8) + 0x20);
          local_b0._16_8_ = *(undefined8 *)(*(long *)(lVar1 + 8) + 0x28);
          local_78 = **(undefined8 **)(local_c8 + 8);
          local_80 = (*(undefined8 **)(local_c8 + 8))[1];
          local_b0.first.ctrl_ = (ctrl_t *)0x6;
          local_b0.first.field_1.slot_ = (slot_type *)0x475d52;
          local_90 = 4;
          local_88 = "\", \"";
          local_70 = 4;
          local_68 = "\"],\n";
          absl::lts_20240722::strings_internal::AppendPieces(__return_storage_ptr__,&local_b0,5);
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(this + 4));
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~raw_hash_set(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpImportList(const FileDescriptor* file) {
  // For each import, find a symbol that comes from that file.
  absl::flat_hash_set<const FileDescriptor*> seen{file};
  std::string ret;
  ForEachField(file, [&](const FieldDescriptor* field) {
    if (!field->message_type()) return;
    const FileDescriptor* f = field->message_type()->file();
    if (!seen.insert(f).second) return;
    absl::StrAppend(&ret, "    [\"", field->message_type()->full_name(),
                    "\", \"", f->name(), "\"],\n");
  });
  return ret;
}